

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall tokenizer::read_symbol(tokenizer *this)

{
  string *__k;
  char *pcVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type type;
  initializer_list<char> __l;
  vector<char,_std::allocator<char>_> symbols;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  char local_28 [16];
  
  builtin_strncpy(local_28,"+-*/%<>=!&|",0xb);
  __l._M_len = 0xb;
  __l._M_array = local_28;
  std::vector<char,_std::allocator<char>_>::vector(&local_40,__l,&local_41);
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  if (*this->line_char != '\0') {
    do {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (_Var2._M_current ==
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->current_word,*this->line_char);
      pcVar1 = this->line_char;
      this->line_char = pcVar1 + 1;
      this->position_number = this->position_number + 1;
    } while (pcVar1[1] != '\0');
  }
  __k = &this->current_word;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
          ::find(&(this->symbol_to_type)._M_t,__k);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->keyword_to_token_type)._M_t._M_impl.super__Rb_tree_header) {
    type = invalid;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
             ::operator[](&this->symbol_to_type,__k);
    type = *pmVar4;
  }
  add_token_to_stream(this,type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__k,0,(this->current_word)._M_string_length,"",0);
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void tokenizer::read_symbol() {
    vector<char> symbols = {'+', '-', '*', '/', '%', '<', '>', '=', '!', '&', '|'};

    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(find(symbols.begin(), symbols.end(), *line_char) != symbols.end()) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    if(symbol_to_type.find(current_word) == keyword_to_token_type.end()) {
        this->add_token_to_stream(Token_Type::invalid);
    }
    else {
        this->add_token_to_stream(symbol_to_type[current_word]);
    }

    //position_number += current_word.length();
    current_word = "";
}